

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::TranslateWindowsInViewport(ImGuiViewportP *viewport,ImVec2 *old_pos,ImVec2 *new_pos)

{
  ImVec2 IVar1;
  uint uVar2;
  uint uVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  ImGuiWindow **ppIVar12;
  undefined8 extraout_RAX;
  int window_n;
  int i;
  ImVector<ImGuiWindow_*> *this;
  int iVar13;
  int iVar14;
  float fVar15;
  float fVar16;
  ImRect IVar17;
  ImVec2 delta_pos;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  if ((viewport->Window != (ImGuiWindow *)0x0) ||
     (((viewport->super_ImGuiViewport).Flags & 0x200) == 0)) {
    __assert_fail("viewport->Window == __null && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2b3f,
                  "void ImGui::TranslateWindowsInViewport(ImGuiViewportP *, const ImVec2 &, const ImVec2 &)"
                 );
  }
  uVar2 = GImGui->ConfigFlagsLastFrame;
  uVar3 = GImGui->ConfigFlagsCurrFrame;
  local_48 = *old_pos;
  IVar1 = (viewport->super_ImGuiViewport).Size;
  local_58 = IVar1.x + local_48.x;
  fStack_54 = IVar1.y + local_48.y;
  uStack_50 = 0;
  uStack_40 = 0;
  local_60.y = (*new_pos).y - local_48.y;
  local_60.x = (*new_pos).x - local_48.x;
  this = &GImGui->Windows;
  i = 0;
  do {
    if (this->Size <= i) {
      return;
    }
    if (((uVar2 ^ uVar3) >> 10 & 1) == 0) {
      ppIVar12 = ImVector<ImGuiWindow_*>::operator[](this,i);
      if ((*ppIVar12)->Viewport == viewport) {
        ppIVar12 = ImVector<ImGuiWindow_*>::operator[](this,i);
        IVar17 = ImGuiWindow::Rect(*ppIVar12);
        bVar5 = local_48.x <= IVar17.Min.x;
        iVar13 = -(uint)(IVar17.Max.x <= local_58);
        iVar14 = -(uint)(IVar17.Max.y <= fStack_54);
        auVar7._4_4_ = iVar13;
        auVar7._0_4_ = iVar13;
        auVar7._8_4_ = iVar14;
        auVar7._12_4_ = iVar14;
        uVar11 = movmskpd((int)CONCAT71((int7)((ulong)extraout_RAX >> 8),bVar5),auVar7);
        if ((byte)(((byte)uVar11 & 2) >> 1 & -(local_48.y <= IVar17.Min.y) & bVar5 & (byte)uVar11)
            == 1) goto LAB_00130ccf;
      }
    }
    else {
LAB_00130ccf:
      ppIVar12 = ImVector<ImGuiWindow_*>::operator[](this,i);
      pIVar4 = *ppIVar12;
      IVar1.y = (pIVar4->Pos).y + local_60.y;
      IVar1.x = (pIVar4->Pos).x + local_60.x;
      pIVar4->Pos = IVar1;
      ImRect::Translate(&pIVar4->ClipRect,&local_60);
      ImRect::Translate(&pIVar4->OuterRectClipped,&local_60);
      ImRect::Translate(&pIVar4->InnerRect,&local_60);
      fVar15 = local_60.x;
      fVar16 = local_60.y;
      IVar1 = (pIVar4->DC).CursorPos;
      IVar6.y = IVar1.y + fVar16;
      IVar6.x = IVar1.x + fVar15;
      (pIVar4->DC).CursorPos = IVar6;
      fVar8 = (pIVar4->DC).CursorStartPos.y;
      fVar9 = (pIVar4->DC).CursorMaxPos.x;
      fVar10 = (pIVar4->DC).CursorMaxPos.y;
      (pIVar4->DC).CursorStartPos.x = (pIVar4->DC).CursorStartPos.x + fVar15;
      (pIVar4->DC).CursorStartPos.y = fVar8 + fVar16;
      (pIVar4->DC).CursorMaxPos.x = fVar9 + fVar15;
      (pIVar4->DC).CursorMaxPos.y = fVar10 + fVar16;
      ImRect::Translate(&(pIVar4->DC).LastItemRect,&local_60);
      ImRect::Translate(&(pIVar4->DC).LastItemDisplayRect,&local_60);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void ImGui::TranslateWindowsInViewport(ImGuiViewportP* viewport, const ImVec2& old_pos, const ImVec2& new_pos)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(viewport->Window == NULL && (viewport->Flags & ImGuiViewportFlags_CanHostOtherWindows));

    // 1) We test if ImGuiConfigFlags_ViewportsEnable was just toggled, which allows us to conveniently
    // translate imgui windows from OS-window-local to absolute coordinates or vice-versa.
    // 2) If it's not going to fit into the new size, keep it at same absolute position.
    // One problem with this is that most Win32 applications doesn't update their render while dragging,
    // and so the window will appear to teleport when releasing the mouse.
    const bool translate_all_windows = (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable) != (g.ConfigFlagsLastFrame & ImGuiConfigFlags_ViewportsEnable);
    ImRect test_still_fit_rect(old_pos, old_pos + viewport->Size);
    ImVec2 delta_pos = new_pos - old_pos;
    for (int window_n = 0; window_n < g.Windows.Size; window_n++) // FIXME-OPT
        if (translate_all_windows || (g.Windows[window_n]->Viewport == viewport && test_still_fit_rect.Contains(g.Windows[window_n]->Rect())))
            TranslateWindow(g.Windows[window_n], delta_pos);
}